

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_static.cxx
# Opt level: O0

void __thiscall
read_sound_src::operator()(read_sound_src *this,sound_src_data **_sound_src,xr_reader *r)

{
  sound_src_data *this_00;
  size_t sVar1;
  float fVar2;
  byte local_39;
  size_t size;
  sound_src_data *psStack_28;
  bool compressed;
  sound_src_data *sound_src;
  xr_reader *r_local;
  sound_src_data **_sound_src_local;
  read_sound_src *this_local;
  
  sound_src = (sound_src_data *)r;
  r_local = (xr_reader *)_sound_src;
  _sound_src_local = (sound_src_data **)this;
  this_00 = (sound_src_data *)operator_new(0x50);
  xray_re::sound_src_data::sound_src_data(this_00);
  r_local->_vptr_xr_reader = (_func_int **)this_00;
  psStack_28 = this_00;
  sVar1 = xray_re::xr_reader::find_chunk((xr_reader *)sound_src,0,(bool *)((long)&size + 7),true);
  local_39 = 0;
  if (sVar1 != 0) {
    local_39 = size._7_1_ ^ 0xff;
  }
  if ((local_39 & 1) == 0) {
    __assert_fail("size && !compressed",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_snd_static.cxx"
                  ,0x13,"void read_sound_src::operator()(sound_src_data *&, xr_reader &) const");
  }
  xray_re::xr_reader::r_sz((xr_reader *)sound_src,&psStack_28->name);
  xray_re::xr_reader::r_fvector3((xr_reader *)sound_src,&psStack_28->position);
  fVar2 = xray_re::xr_reader::r_float((xr_reader *)sound_src);
  psStack_28->volume = fVar2;
  fVar2 = xray_re::xr_reader::r_float((xr_reader *)sound_src);
  psStack_28->freq = fVar2;
  xray_re::xr_reader::r_i32vector2((xr_reader *)sound_src,&psStack_28->active_time);
  xray_re::xr_reader::r_i32vector2((xr_reader *)sound_src,&psStack_28->play_time);
  xray_re::xr_reader::r_i32vector2((xr_reader *)sound_src,&psStack_28->pause_time);
  return;
}

Assistant:

void operator()(sound_src_data*& _sound_src, xr_reader& r) const {
	sound_src_data* sound_src = new sound_src_data;
	_sound_src = sound_src;
	bool compressed;
	size_t size = r.find_chunk(0, &compressed);
	xr_assert(size && !compressed);
	r.r_sz(sound_src->name);
	r.r_fvector3(sound_src->position);
	sound_src->volume = r.r_float();
	sound_src->freq = r.r_float();
	r.r_i32vector2(sound_src->active_time);
	r.r_i32vector2(sound_src->play_time);
	r.r_i32vector2(sound_src->pause_time);
}